

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_call(mg_connection *nc,mg_event_handler_t ev_handler,int ev,void *ev_data)

{
  ulong uVar1;
  char *pcVar2;
  mg_event_handler_t local_38;
  unsigned_long flags_before;
  void *ev_data_local;
  mg_event_handler_t p_Stack_18;
  int ev_local;
  mg_event_handler_t ev_handler_local;
  mg_connection *nc_local;
  
  p_Stack_18 = ev_handler;
  if (ev_handler == (mg_event_handler_t)0x0) {
    if (nc->proto_handler == (mg_event_handler_t)0x0) {
      local_38 = nc->handler;
    }
    else {
      local_38 = nc->proto_handler;
    }
    p_Stack_18 = local_38;
  }
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_call");
    pcVar2 = "proto";
    if (p_Stack_18 == nc->handler) {
      pcVar2 = "user";
    }
    cs_log_printf("%p %s ev=%d ev_data=%p flags=%lu rmbl=%d smbl=%d",nc,pcVar2,(ulong)(uint)ev,
                  ev_data,nc->flags,(int)(nc->recv_mbuf).len,(int)(nc->send_mbuf).len);
  }
  if (((nc->mgr->hexdump_file != (char *)0x0) && (ev != 0)) && (ev != 4)) {
    if (ev == 3) {
      mg_hexdump_connection(nc,nc->mgr->hexdump_file,(nc->recv_mbuf).buf,*ev_data,3);
    }
    else {
      mg_hexdump_connection(nc,nc->mgr->hexdump_file,(void *)0x0,0,ev);
    }
  }
  if (p_Stack_18 != (mg_event_handler_t)0x0) {
    uVar1 = nc->flags;
    (*p_Stack_18)(nc,ev,ev_data);
    if ((p_Stack_18 == nc->handler) && (nc->flags != uVar1)) {
      nc->flags = uVar1 & 0xfffffffffc0fc37f | nc->flags & 0x3f03c80;
    }
  }
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_call");
    pcVar2 = "proto";
    if (p_Stack_18 == nc->handler) {
      pcVar2 = "user";
    }
    cs_log_printf("%p after %s flags=%lu rmbl=%d smbl=%d",nc,pcVar2,nc->flags,
                  (nc->recv_mbuf).len & 0xffffffff,(nc->send_mbuf).len & 0xffffffff);
  }
  return;
}

Assistant:

MG_INTERNAL void mg_call(struct mg_connection *nc,
                         mg_event_handler_t ev_handler, int ev, void *ev_data) {
    unsigned long flags_before;
    if (ev_handler == NULL) {
        /*
     * If protocol handler is specified, call it. Otherwise, call user-specified
     * event handler.
     */
        ev_handler = nc->proto_handler ? nc->proto_handler : nc->handler;
    }
    DBG(("%p %s ev=%d ev_data=%p flags=%lu rmbl=%d smbl=%d", nc,
            ev_handler == nc->handler ? "user" : "proto", ev, ev_data, nc->flags,
            (int) nc->recv_mbuf.len, (int) nc->send_mbuf.len));

#if !defined(NO_LIBC) && !defined(MG_DISABLE_HEXDUMP)
    /* LCOV_EXCL_START */
    if (nc->mgr->hexdump_file != NULL && ev != MG_EV_POLL &&
        ev != MG_EV_SEND /* handled separately */) {
        if (ev == MG_EV_RECV) {
            mg_hexdump_connection(nc, nc->mgr->hexdump_file, nc->recv_mbuf.buf,
                                  *(int *) ev_data, ev);
        } else {
            mg_hexdump_connection(nc, nc->mgr->hexdump_file, NULL, 0, ev);
        }
    }
/* LCOV_EXCL_STOP */
#endif
    if (ev_handler != NULL) {
        flags_before = nc->flags;
        ev_handler(nc, ev, ev_data);
        /* Prevent user handler from fiddling with system flags. */
        if (ev_handler == nc->handler && nc->flags != flags_before) {
            nc->flags = (flags_before & ~_MG_CALLBACK_MODIFIABLE_FLAGS_MASK) |
                        (nc->flags & _MG_CALLBACK_MODIFIABLE_FLAGS_MASK);
        }
    }
    DBG(("%p after %s flags=%lu rmbl=%d smbl=%d", nc,
            ev_handler == nc->handler ? "user" : "proto", nc->flags,
            (int) nc->recv_mbuf.len, (int) nc->send_mbuf.len));
}